

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall tinyusdz::AttrMetas::authored(AttrMetas *this)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  bool local_11;
  AttrMetas *this_local;
  
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)this);
  local_11 = true;
  if (!bVar1) {
    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&this->elementSize);
    local_11 = true;
    if (!bVar1) {
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&this->hidden);
      local_11 = true;
      if (!bVar1) {
        bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                          ((optional *)&this->customData);
        local_11 = true;
        if (!bVar1) {
          bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&this->weight);
          local_11 = true;
          if (!bVar1) {
            bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                              ((optional *)&this->connectability);
            local_11 = true;
            if (!bVar1) {
              bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                ((optional *)&this->outputName);
              local_11 = true;
              if (!bVar1) {
                bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                  ((optional *)&this->renderType);
                local_11 = true;
                if (!bVar1) {
                  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                    ((optional *)&this->sdrMetadata);
                  local_11 = true;
                  if (!bVar1) {
                    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                      ((optional *)&this->displayName);
                    local_11 = true;
                    if (!bVar1) {
                      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                        ((optional *)&this->displayGroup);
                      local_11 = true;
                      if (!bVar1) {
                        bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                          ((optional *)&this->bindMaterialAs);
                        local_11 = true;
                        if (!bVar1) {
                          sVar2 = std::
                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                  ::size(&this->meta);
                          local_11 = true;
                          if (sVar2 == 0) {
                            sVar3 = std::
                                    vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                                    ::size(&this->stringData);
                            local_11 = sVar3 != 0;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_11;
}

Assistant:

bool authored() const {
    return (interpolation || elementSize || hidden || customData || weight ||
            connectability || outputName || renderType || sdrMetadata || displayName || displayGroup || bindMaterialAs || meta.size() || stringData.size());
  }